

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall cmFileCopier::Install(cmFileCopier *this,char *fromFile,char *toFile)

{
  cmCommand *this_00;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  MatchProperties match_properties;
  size_t sVar4;
  ostringstream e;
  allocator local_1c9;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  if (*fromFile == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"INSTALL encountered an empty string input file name.",0x34);
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_00,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar2 = 0;
  }
  else {
    match_properties = CollectMatchProperties(this,fromFile);
    uVar2 = 1;
    if (((ulong)match_properties & 1) == 0) {
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      sVar4 = strlen(fromFile);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,fromFile,fromFile + sVar4)
      ;
      std::__cxx11::string::string((string *)&local_1c8,toFile,&local_1c9);
      bVar1 = cmsys::SystemTools::SameFile(local_1a8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar1) {
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        sVar4 = strlen(fromFile);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,fromFile,fromFile + sVar4);
        bVar1 = cmsys::SystemTools::FileIsSymlink(local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if (bVar1) {
          uVar2 = InstallSymlink(this,fromFile,toFile);
        }
        else {
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          sVar4 = strlen(fromFile);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,fromFile,fromFile + sVar4);
          bVar1 = cmsys::SystemTools::FileIsDirectory(local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if (bVar1) {
            uVar2 = InstallDirectory(this,fromFile,toFile,match_properties);
          }
          else {
            bVar1 = cmsys::SystemTools::FileExists(fromFile);
            if (bVar1) {
              uVar2 = InstallFile(this,fromFile,toFile,match_properties);
            }
            else {
              iVar3 = (*this->_vptr_cmFileCopier[5])(this,fromFile);
              uVar2 = (undefined1)iVar3;
            }
          }
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

bool cmFileCopier::Install(const char* fromFile, const char* toFile)
{
  if (!*fromFile) {
    std::ostringstream e;
    e << "INSTALL encountered an empty string input file name.";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if (match_properties.Exclude) {
    return true;
  }

  if (cmSystemTools::SameFile(fromFile, toFile)) {
    return true;
  }
  if (cmSystemTools::FileIsSymlink(fromFile)) {
    return this->InstallSymlink(fromFile, toFile);
  }
  if (cmSystemTools::FileIsDirectory(fromFile)) {
    return this->InstallDirectory(fromFile, toFile, match_properties);
  }
  if (cmSystemTools::FileExists(fromFile)) {
    return this->InstallFile(fromFile, toFile, match_properties);
  }
  return this->ReportMissing(fromFile);
}